

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::branch(CompilerGLSL *this,BlockID from,BlockID to)

{
  byte bVar1;
  byte bVar2;
  SPIRBlock *pSVar3;
  ulong uVar4;
  
  flush_phi(this,from,to);
  Compiler::flush_control_dependent_expressions(&this->super_Compiler,from.id);
  bVar1 = (this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>.ptr[to.id];
  bVar2 = bVar1;
  if ((bVar1 & 1) != 0) {
    pSVar3 = Variant::get<spirv_cross::SPIRBlock>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        from.id);
    if ((pSVar3->loop_dominator).id == to.id) {
      statement<char_const(&)[10]>(this,(char (*) [10])"continue;");
      return;
    }
    bVar2 = (this->super_Compiler).ir.block_meta.super_VectorView<unsigned_char>.ptr[to.id];
  }
  if ((bVar2 & 0x14) != 0) {
    if (((bVar2 & 4) != 0 && this->current_emitting_switch != (SPIRBlock *)0x0) &&
       (uVar4 = (ulong)(this->current_emitting_switch->loop_dominator).id, uVar4 != 0xffffffff)) {
      pSVar3 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar4);
      if ((pSVar3->merge_block).id == to.id) {
        pSVar3 = this->current_emitting_switch;
        if (pSVar3->need_ladder_break == false) {
          Compiler::force_recompile(&this->super_Compiler);
          pSVar3 = this->current_emitting_switch;
          pSVar3->need_ladder_break = true;
        }
        statement<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[22]>
                  (this,(char (*) [2])0x2e3de5,&(pSVar3->super_IVariant).self,
                   (char (*) [22])"_ladder_break = true;");
      }
    }
    statement<char_const(&)[7]>(this,(char (*) [7])0x2eb97c);
    return;
  }
  if ((bVar1 & 2) == 0) {
    if (from.id == to.id) {
LAB_001e51db:
      branch_to_continue(this,from,to);
      return;
    }
    if ((bVar2 & 8) == 0) {
      pSVar3 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          to.id);
      emit_block_chain(this,pSVar3);
      return;
    }
  }
  else if ((bVar2 & 8) == 0) goto LAB_001e51db;
  return;
}

Assistant:

void CompilerGLSL::branch(BlockID from, BlockID to)
{
	flush_phi(from, to);
	flush_control_dependent_expressions(from);

	bool to_is_continue = is_continue(to);

	// This is only a continue if we branch to our loop dominator.
	if ((ir.block_meta[to] & ParsedIR::BLOCK_META_LOOP_HEADER_BIT) != 0 && get<SPIRBlock>(from).loop_dominator == to)
	{
		// This can happen if we had a complex continue block which was emitted.
		// Once the continue block tries to branch to the loop header, just emit continue;
		// and end the chain here.
		statement("continue;");
	}
	else if (is_break(to))
	{
		// Very dirty workaround.
		// Switch constructs are able to break, but they cannot break out of a loop at the same time.
		// Only sensible solution is to make a ladder variable, which we declare at the top of the switch block,
		// write to the ladder here, and defer the break.
		// The loop we're breaking out of must dominate the switch block, or there is no ladder breaking case.
		if (current_emitting_switch && is_loop_break(to) &&
		    current_emitting_switch->loop_dominator != BlockID(SPIRBlock::NoDominator) &&
		    get<SPIRBlock>(current_emitting_switch->loop_dominator).merge_block == to)
		{
			if (!current_emitting_switch->need_ladder_break)
			{
				force_recompile();
				current_emitting_switch->need_ladder_break = true;
			}

			statement("_", current_emitting_switch->self, "_ladder_break = true;");
		}
		statement("break;");
	}
	else if (to_is_continue || from == to)
	{
		// For from == to case can happen for a do-while loop which branches into itself.
		// We don't mark these cases as continue blocks, but the only possible way to branch into
		// ourselves is through means of continue blocks.

		// If we are merging to a continue block, there is no need to emit the block chain for continue here.
		// We can branch to the continue block after we merge execution.

		// Here we make use of structured control flow rules from spec:
		// 2.11: - the merge block declared by a header block cannot be a merge block declared by any other header block
		//       - each header block must strictly dominate its merge block, unless the merge block is unreachable in the CFG
		// If we are branching to a merge block, we must be inside a construct which dominates the merge block.
		auto &block_meta = ir.block_meta[to];
		bool branching_to_merge =
		    (block_meta & (ParsedIR::BLOCK_META_SELECTION_MERGE_BIT | ParsedIR::BLOCK_META_MULTISELECT_MERGE_BIT |
		                   ParsedIR::BLOCK_META_LOOP_MERGE_BIT)) != 0;
		if (!to_is_continue || !branching_to_merge)
			branch_to_continue(from, to);
	}
	else if (!is_conditional(to))
		emit_block_chain(get<SPIRBlock>(to));

	// It is important that we check for break before continue.
	// A block might serve two purposes, a break block for the inner scope, and
	// a continue block in the outer scope.
	// Inner scope always takes precedence.
}